

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* Gudhi::read_lower_triangular_matrix_from_csv_file<float>
            (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *__return_storage_ptr__,string *filename,char separator)

{
  pointer *this;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  float local_43c;
  double local_438;
  double entry;
  vector<float,_std::allocator<float>_> values_in_this_line_1;
  istringstream aiStack_410 [4];
  int number_of_entry;
  istringstream iss;
  char local_289;
  char *local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  int local_274;
  undefined1 local_270 [4];
  int number_of_line;
  vector<float,_std::allocator<float>_> values_in_this_line;
  string line;
  istream local_228 [8];
  ifstream in;
  char local_19;
  string *psStack_18;
  char separator_local;
  string *filename_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *result;
  
  local_19 = separator;
  psStack_18 = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__);
  std::ifstream::ifstream(local_228);
  _Var3 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)local_228,_Var3);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    this = &values_in_this_line.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)this);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,(string *)this);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_270);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)local_270);
    local_274 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_228,
                          (string *)
                          &values_in_this_line.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if ((!bVar2) || (lVar5 = std::__cxx11::string::size(), lVar5 == 0)) break;
      std::__cxx11::string::size();
      pcVar6 = (char *)std::__cxx11::string::operator[]
                                 ((ulong)&values_in_this_line.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage);
      if (*pcVar6 == local_19) {
        std::__cxx11::string::pop_back();
      }
      local_280._M_current = (char *)std::__cxx11::string::begin();
      local_288 = (char *)std::__cxx11::string::end();
      local_289 = ' ';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_280,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_288,&local_19,&local_289);
      std::__cxx11::istringstream::istringstream
                (aiStack_410,
                 (string *)
                 &values_in_this_line.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,_S_in);
      values_in_this_line_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&entry);
      while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
        std::istream::operator>>((istream *)aiStack_410,&local_438);
        if (values_in_this_line_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <= local_274) {
          local_43c = (float)local_438;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&entry,&local_43c);
        }
        values_in_this_line_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             values_in_this_line_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      bVar2 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)&entry);
      if (!bVar2) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&entry);
      }
      local_274 = local_274 + 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&entry);
      std::__cxx11::istringstream::~istringstream(aiStack_410);
    }
    std::ifstream::close();
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_270);
    std::__cxx11::string::~string
              ((string *)
               &values_in_this_line.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Filtration_value>> read_lower_triangular_matrix_from_csv_file(const std::string& filename,
                                                                                      const char separator = ';') {
#ifdef DEBUG_TRACES
  std::clog << "Using procedure read_lower_triangular_matrix_from_csv_file \n";
#endif  // DEBUG_TRACES
  std::vector<std::vector<Filtration_value>> result;
  std::ifstream in;
  in.open(filename.c_str());
  if (!in.is_open()) {
    return result;
  }

  std::string line;

  // the first line is empty, so we ignore it:
  std::getline(in, line);
  std::vector<Filtration_value> values_in_this_line;
  result.push_back(values_in_this_line);

  int number_of_line = 0;

  // first, read the file line by line to a string:
  while (std::getline(in, line)) {
    // if line is empty, break
    if (line.size() == 0) break;

    // if the last element of a string is comma:
    if (line[line.size() - 1] == separator) {
      // then shrink the string by one
      line.pop_back();
    }

    // replace all commas with spaces
    std::replace(line.begin(), line.end(), separator, ' ');

    // put the new line to a stream
    std::istringstream iss(line);
    // and now read the doubles.

    int number_of_entry = 0;
    std::vector<Filtration_value> values_in_this_line;
    while (iss.good()) {
      double entry;
      iss >> entry;
      if (number_of_entry <= number_of_line) {
        values_in_this_line.push_back(entry);
      }
      ++number_of_entry;
    }
    if (!values_in_this_line.empty()) result.push_back(values_in_this_line);
    ++number_of_line;
  }
  in.close();

#ifdef DEBUG_TRACES
  std::clog << "Here is the matrix we read : \n";
  for (size_t i = 0; i != result.size(); ++i) {
    for (size_t j = 0; j != result[i].size(); ++j) {
      std::clog << result[i][j] << " ";
    }
    std::clog << std::endl;
  }
#endif  // DEBUG_TRACES

  return result;
}